

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::StyledStreamWriter::writeArrayValue(StyledStreamWriter *this,Value *value)

{
  pointer pbVar1;
  bool bVar2;
  byte bVar3;
  ArrayIndex AVar4;
  undefined4 extraout_var;
  Value *root;
  ulong uVar5;
  long lVar6;
  String local_60;
  ulong local_40;
  pointer local_38;
  
  AVar4 = Value::size(value);
  local_40 = CONCAT44(extraout_var,AVar4);
  if (AVar4 == 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"[]","");
    pushValue(this,&local_60);
  }
  else {
    bVar2 = isMultilineArray(this,value);
    if (!bVar2) {
      uVar5 = (long)(this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar5 == (local_40 & 0xffffffff)) {
        std::__ostream_insert<char,std::char_traits<char>>(this->document_,"[ ",2);
        lVar6 = 0;
        do {
          if (lVar6 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(this->document_,", ",2);
          }
          pbVar1 = (this->childValues_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    (this->document_,*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar6),
                     *(long *)((long)&pbVar1->_M_string_length + lVar6));
          lVar6 = lVar6 + 0x20;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
        std::__ostream_insert<char,std::char_traits<char>>(this->document_," ]",2);
        return;
      }
      __assert_fail("childValues_.size() == size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/springkim[P]cip/src/jsoncpp.cpp"
                    ,0x12bf,"void Json::StyledStreamWriter::writeArrayValue(const Value &)");
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"[","");
    writeWithIndent(this,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append
              ((char *)&this->indentString_,(ulong)(this->indentation_)._M_dataplus._M_p);
    local_38 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->childValues_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_40 = (ulong)((int)local_40 - 1);
    lVar6 = 0;
    uVar5 = 0;
    while( true ) {
      root = Value::operator[](value,(ArrayIndex)uVar5);
      writeCommentBeforeValue(this,root);
      if (local_38 == pbVar1) {
        bVar3 = this->field_0x68;
        if ((bVar3 & 2) == 0) {
          writeIndent(this);
          bVar3 = this->field_0x68;
        }
        this->field_0x68 = bVar3 | 2;
        writeValue(this,root);
        this->field_0x68 = this->field_0x68 & 0xfd;
      }
      else {
        writeWithIndent(this,(String *)
                             ((long)&(((this->childValues_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar6));
      }
      if (local_40 == uVar5) break;
      uVar5 = uVar5 + 1;
      std::__ostream_insert<char,std::char_traits<char>>(this->document_,",",1);
      writeCommentAfterValueOnSameLine(this,root);
      lVar6 = lVar6 + 0x20;
    }
    writeCommentAfterValueOnSameLine(this,root);
    unindent(this);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"]","");
    writeWithIndent(this,&local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void StyledStreamWriter::writeArrayValue(const Value& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultilineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          if (!indented_)
            writeIndent();
          indented_ = true;
          writeValue(childValue);
          indented_ = false;
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *document_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      *document_ << "[ ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          *document_ << ", ";
        *document_ << childValues_[index];
      }
      *document_ << " ]";
    }
  }
}